

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O2

Vec_Wrd_t * Abc_NtkShareSuperXor(Abc_Obj_t *pObj,int *pfCompl,int *pCounter)

{
  uint __line;
  int iVar1;
  Vec_Wrd_t *p;
  word wVar2;
  word wVar3;
  Abc_Obj_t *pAVar4;
  int iVar5;
  int iVar6;
  char *__assertion;
  bool bVar7;
  uint local_64;
  Abc_Obj_t *pObj0;
  uint *local_50;
  int *local_48;
  Abc_Ntk_t *local_40;
  Abc_Obj_t *pObj1;
  
  local_48 = pCounter;
  if (((ulong)pObj & 1) == 0) {
    local_40 = pObj->pNtk;
    pAVar4 = pObj;
    iVar1 = Abc_NodeIsExorType(pObj);
    if (iVar1 != 0) {
      p = Vec_WrdAlloc((int)pAVar4);
      Vec_WrdPush(p,(ulong)(*(uint *)&pObj->field_0x14 >> 0xc) << 0x20 | (long)pObj->Id);
      local_64 = 0;
      do {
        iVar1 = p->nSize;
        if (iVar1 < 1) {
LAB_00237bde:
          *pfCompl = local_64;
          for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
            wVar2 = Vec_WrdEntry(p,iVar5);
            Vec_WrdWriteEntry(p,iVar5,(long)(int)wVar2);
          }
          return p;
        }
        wVar2 = Vec_WrdEntry(p,0);
        iVar5 = 1;
        while (iVar6 = iVar1, iVar1 != iVar5) {
          wVar3 = Vec_WrdEntry(p,iVar5);
          iVar5 = iVar5 + 1;
          bVar7 = wVar3 <= wVar2;
          wVar2 = wVar3;
          if (bVar7) {
            __assertion = "Num < NumNext";
            __line = 0x71;
            goto LAB_00237c31;
          }
        }
        do {
          if (iVar6 < 1) goto LAB_00237bde;
          wVar2 = Vec_WrdEntry(p,iVar6 + -1);
          pAVar4 = Abc_NtkObj(local_40,(int)wVar2);
          iVar5 = Abc_NodeIsExorType(pAVar4);
          iVar6 = iVar6 + -1;
        } while (iVar5 == 0);
        local_50 = (uint *)pfCompl;
        Vec_WrdRemove(p,wVar2);
        pAVar4 = Abc_NodeRecognizeMux(pAVar4,&pObj1,&pObj0);
        if (pObj1 != (Abc_Obj_t *)((ulong)pObj0 ^ 1)) {
          __assert_fail("pObj1 == Abc_ObjNot(pObj0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                        ,0x82,"Vec_Wrd_t *Abc_NtkShareSuperXor(Abc_Obj_t *, int *, int *)");
        }
        local_64 = local_64 ^ ((uint)pObj0 ^ (uint)pAVar4) & 1;
        pObj0 = (Abc_Obj_t *)((ulong)pObj0 & 0xfffffffffffffffe);
        Vec_WrdPushOrder(p,(ulong)(*(uint *)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x14) >> 0xc) <<
                           0x20 | (long)*(int *)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x10));
        Vec_WrdPushOrder(p,(ulong)(*(uint *)&pObj0->field_0x14 >> 0xc) << 0x20 | (long)pObj0->Id);
        *local_48 = *local_48 + 1;
        iVar1 = p->nSize;
        iVar5 = 0;
        iVar6 = 0;
        while (iVar5 < iVar1) {
          wVar2 = Vec_WrdEntry(p,iVar5);
          if (iVar1 + -1 == iVar5) {
            Vec_WrdWriteEntry(p,iVar6,wVar2);
            iVar6 = iVar6 + 1;
            break;
          }
          wVar3 = Vec_WrdEntry(p,iVar5 + 1);
          if (wVar3 < wVar2) {
            __assert_fail("Num <= NumNext",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                          ,0x92,"Vec_Wrd_t *Abc_NtkShareSuperXor(Abc_Obj_t *, int *, int *)");
          }
          if (wVar2 == wVar3) {
            iVar5 = iVar5 + 2;
          }
          else {
            Vec_WrdWriteEntry(p,iVar6,wVar2);
            iVar5 = iVar5 + 1;
            iVar6 = iVar6 + 1;
          }
        }
        Vec_WrdShrink(p,iVar6);
        pfCompl = (int *)local_50;
      } while( true );
    }
    __assertion = "Abc_NodeIsExorType(pObj)";
    __line = 0x67;
  }
  else {
    __assertion = "!Abc_ObjIsComplement(pObj)";
    __line = 0x66;
  }
LAB_00237c31:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                ,__line,"Vec_Wrd_t *Abc_NtkShareSuperXor(Abc_Obj_t *, int *, int *)");
}

Assistant:

Vec_Wrd_t * Abc_NtkShareSuperXor( Abc_Obj_t * pObj, int * pfCompl, int * pCounter )
{
    Abc_Ntk_t * pNtk = Abc_ObjNtk(pObj);
    Abc_Obj_t * pObjC, * pObj0, * pObj1, * pRoot = NULL;
    Vec_Wrd_t * vSuper;
    word Num, NumNext;
    int i, k, fCompl = 0;
    assert( !Abc_ObjIsComplement(pObj) );
    assert( Abc_NodeIsExorType(pObj) );
    // start iteration
    vSuper = Vec_WrdAlloc( 10 );
    Vec_WrdPush( vSuper, Abc_NtkSharePack(Abc_ObjLevel(pObj), Abc_ObjId(pObj)) );
    while ( Vec_WrdSize(vSuper) > 0 )
    {
        // make sure there are no duplicates
        Num = Vec_WrdEntry( vSuper, 0 );
        Vec_WrdForEachEntryStart( vSuper, NumNext, i, 1 )
        {
            assert( Num < NumNext );
            Num = NumNext;
        }
        // extract XOR gate decomposable on the topmost level
        Vec_WrdForEachEntryReverse( vSuper, Num, i )
        {
            pRoot = Abc_NtkObj( pNtk, Abc_NtkShareUnpackId(Num) );
            if ( Abc_NodeIsExorType(pRoot) )
            {
                Vec_WrdRemove( vSuper, Num );
                break;
            }
        }
        if ( i == -1 )
            break;
        // extract
        pObjC = Abc_NodeRecognizeMux( pRoot, &pObj1, &pObj0 );
        assert( pObj1 == Abc_ObjNot(pObj0) );
        fCompl ^= Abc_ObjIsComplement(pObjC);  pObjC = Abc_ObjRegular(pObjC);
        fCompl ^= Abc_ObjIsComplement(pObj0);  pObj0 = Abc_ObjRegular(pObj0);
        Vec_WrdPushOrder( vSuper, Abc_NtkSharePack(Abc_ObjLevel(pObjC), Abc_ObjId(pObjC)) );
        Vec_WrdPushOrder( vSuper, Abc_NtkSharePack(Abc_ObjLevel(pObj0), Abc_ObjId(pObj0)) );
        (*pCounter)++;
        // remove duplicates
        k = 0;
        Vec_WrdForEachEntry( vSuper, Num, i )
        {
            if ( i + 1 == Vec_WrdSize(vSuper) )
            {
                Vec_WrdWriteEntry( vSuper, k++, Num );
                break;
            }
            NumNext = Vec_WrdEntry( vSuper, i+1 );
            assert( Num <= NumNext );
            if ( Num == NumNext )
                i++;
            else
                Vec_WrdWriteEntry( vSuper, k++, Num );
        }
        Vec_WrdShrink( vSuper, k );
    }
    *pfCompl = fCompl;
    Vec_WrdForEachEntry( vSuper, Num, i )
        Vec_WrdWriteEntry( vSuper, i, Abc_NtkShareUnpackId(Num) );
    return vSuper;
}